

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection_handle.cpp
# Opt level: O3

bool __thiscall
libtorrent::bt_peer_connection_handle::supports_encryption(bt_peer_connection_handle *this)

{
  byte bVar1;
  shared_ptr<libtorrent::aux::bt_peer_connection> pc;
  long local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  native_handle((bt_peer_connection_handle *)&local_18);
  bVar1 = *(byte *)(local_18 + 0x889);
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return (bool)((bVar1 & 0x40) >> 6);
}

Assistant:

bool bt_peer_connection_handle::supports_encryption() const
{
#if !defined TORRENT_DISABLE_ENCRYPTION
	std::shared_ptr<aux::bt_peer_connection> pc = native_handle();
	TORRENT_ASSERT(pc);
	return pc->supports_encryption();
#else
	return false;
#endif
}